

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2b57d1::TransformSelectorFor::Validate(TransformSelectorFor *this,size_t count)

{
  int iVar1;
  iterator __first;
  iterator __last;
  anon_class_16_2_032a3561 __gen;
  int local_20;
  int step;
  int start;
  int size;
  size_t count_local;
  TransformSelectorFor *this_local;
  
  _start = count;
  count_local = (size_t)this;
  iVar1 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Start,count);
  this->Start = iVar1;
  iVar1 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Stop,_start);
  this->Stop = iVar1;
  step = ((this->Stop - this->Start) + 1) / this->Step;
  if (((this->Stop - this->Start) + 1) % this->Step != 0) {
    step = step + 1;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->super_TransformSelectorIndexes).Indexes,(long)step);
  local_20 = this->Start;
  iVar1 = this->Step;
  __first = std::vector<int,_std::allocator<int>_>::begin
                      (&(this->super_TransformSelectorIndexes).Indexes);
  __last = std::vector<int,_std::allocator<int>_>::end
                     (&(this->super_TransformSelectorIndexes).Indexes);
  __gen.step = iVar1;
  __gen.start = &local_20;
  __gen._12_4_ = 0;
  std::
  generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(anonymous_namespace)::TransformSelectorFor::Validate(unsigned_long)::_lambda()_1_>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             __gen);
  return true;
}

Assistant:

bool Validate(std::size_t count) override
  {
    this->Start = this->NormalizeIndex(this->Start, count);
    this->Stop = this->NormalizeIndex(this->Stop, count);

    // compute indexes
    auto size = (this->Stop - this->Start + 1) / this->Step;
    if ((this->Stop - this->Start + 1) % this->Step != 0) {
      size += 1;
    }

    this->Indexes.resize(size);
    auto start = this->Start, step = this->Step;
    std::generate(this->Indexes.begin(), this->Indexes.end(),
                  [&start, step]() -> int {
                    auto r = start;
                    start += step;
                    return r;
                  });

    return true;
  }